

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O3

int64_t av1_max_level_bitrate(BITSTREAM_PROFILE seq_profile,int seq_level_idx,int seq_tier)

{
  int32_t *piVar1;
  undefined3 in_register_00000039;
  
  piVar1 = high_kbps;
  if (seq_tier == 0) {
    piVar1 = main_kbps;
  }
  return (long)piVar1[seq_level_idx] *
         (long)bitrate_profile_factor[CONCAT31(in_register_00000039,seq_profile)] * 1000;
}

Assistant:

int64_t av1_max_level_bitrate(BITSTREAM_PROFILE seq_profile, int seq_level_idx,
                              int seq_tier) {
  int64_t bitrate;

  if (seq_tier) {
    bitrate = high_kbps[seq_level_idx] * bitrate_profile_factor[seq_profile];
  } else {
    bitrate = main_kbps[seq_level_idx] * bitrate_profile_factor[seq_profile];
  }

  return bitrate * 1000;
}